

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::BaseModeFunction<duckdb::ModeStandard<double>>::
     Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::ModeFunction<duckdb::ModeStandard<double>>>
               (ModeState<double,_duckdb::ModeStandard<double>_> *state,double *key,
               AggregateInputData *input_data)

{
  ulong uVar1;
  Counts *pCVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  
  if (state->frequency_map == (Counts *)0x0) {
    pCVar2 = (Counts *)operator_new(0x38);
    (pCVar2->_M_h)._M_buckets = (__buckets_ptr)0x0;
    (pCVar2->_M_h)._M_bucket_count = 0;
    *(undefined8 *)&(pCVar2->_M_h)._M_rehash_policy = 0;
    (pCVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
    (pCVar2->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pCVar2->_M_h)._M_element_count = 0;
    (pCVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    (pCVar2->_M_h)._M_buckets = &(pCVar2->_M_h)._M_single_bucket;
    (pCVar2->_M_h)._M_bucket_count = 1;
    (pCVar2->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (pCVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
    (pCVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    state->frequency_map = pCVar2;
  }
  pmVar3 = ::std::__detail::
           _Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)state->frequency_map,key);
  pmVar3->count = pmVar3->count + 1;
  uVar1 = state->count;
  uVar4 = pmVar3->first_row;
  if (uVar1 <= pmVar3->first_row) {
    uVar4 = uVar1;
  }
  pmVar3->first_row = uVar4;
  state->count = uVar1 + 1;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &key, AggregateInputData &input_data) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(input_data.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		++i.count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		++state.count;
	}